

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  size_t sVar1;
  ostream *poVar2;
  int local_a0;
  int local_9c;
  MPI_Status status;
  char msg [100];
  uint local_1c;
  int worldSize;
  int myRank;
  char **argv_local;
  int argc_local;
  
  argv_local._4_4_ = 0;
  _worldSize = argv;
  argv_local._0_4_ = argc;
  MPI_Init(&argv_local,&worldSize);
  local_1c = 0;
  msg[0x60] = '\0';
  msg[0x61] = '\0';
  msg[0x62] = '\0';
  msg[99] = '\0';
  MPI_Comm_rank(&ompi_mpi_comm_world,&local_1c);
  MPI_Comm_size(&ompi_mpi_comm_world,msg + 0x60);
  sprintf((char *)&status._ucount,"Hi, I am CPU %d!",(ulong)local_1c);
  sVar1 = strlen((char *)&status._ucount);
  MPI_Send(&status._ucount,(int)sVar1 + 1,&ompi_mpi_char,
           (long)(int)(local_1c + 1) % (long)(int)msg._96_4_ & 0xffffffff,0,&ompi_mpi_comm_world);
  MPI_Recv(&status._ucount,100,&ompi_mpi_char,0xffffffff,0xffffffff,&ompi_mpi_comm_world,&local_a0);
  poVar2 = std::operator<<((ostream *)&std::cout,"\nI am CPU ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_1c);
  poVar2 = std::operator<<(poVar2,". The CPU ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_a0);
  poVar2 = std::operator<<(poVar2," told me: ");
  poVar2 = std::operator<<(poVar2,(char *)&status._ucount);
  poVar2 = std::operator<<(poVar2,"\nStatus.MPI_SOURCE = ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_a0);
  poVar2 = std::operator<<(poVar2,"\nStatus.MPI_TAG = ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_9c);
  poVar2 = std::operator<<(poVar2,"\nStatus.MPI_ERROR = ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,status.MPI_SOURCE);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  MPI_Finalize();
  return 0;
}

Assistant:

int main(int argc, char* argv[])
{
    MPI_Init(&argc, &argv);

    int myRank{}, worldSize{};
    MPI_Comm_rank(MPI_COMM_WORLD, &myRank);
    MPI_Comm_size(MPI_COMM_WORLD, &worldSize);

    char msg[100];
    sprintf(msg, "Hi, I am CPU %d!", myRank);
    MPI_Send(msg, strlen(msg) + 1, MPI_CHAR, (myRank + 1) % worldSize, 0, MPI_COMM_WORLD);

    MPI_Status status;
    MPI_Recv(msg, 100, MPI_CHAR, MPI_ANY_SOURCE, MPI_ANY_TAG, MPI_COMM_WORLD, &status);

    cout << "\nI am CPU " << myRank << ". The CPU " << status.MPI_SOURCE << " told me: " << msg 
         << "\nStatus.MPI_SOURCE = " << status.MPI_SOURCE
         << "\nStatus.MPI_TAG = "<< status.MPI_TAG
         << "\nStatus.MPI_ERROR = "<< status.MPI_ERROR << endl;

    MPI_Finalize();
    return 0;
}